

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O2

int ffppxll(fitsfile *fptr,int datatype,LONGLONG *firstpix,LONGLONG nelem,void *array,int *status)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int naxis;
  LONGLONG naxes [9];
  
  if (0 < *status) {
    return *status;
  }
  ffgidm(fptr,&naxis,status);
  ffgiszll(fptr,9,naxes,status);
  uVar2 = 0;
  uVar1 = (ulong)(uint)naxis;
  if (naxis < 1) {
    uVar1 = uVar2;
  }
  lVar4 = 1;
  lVar3 = 0;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    lVar3 = lVar3 + (firstpix[uVar2] + -1) * lVar4;
    lVar4 = lVar4 * naxes[uVar2];
  }
  lVar3 = lVar3 + 1;
  if (datatype == 0x52) {
    ffpprd(fptr,1,lVar3,nelem,(double *)array,status);
  }
  else if (datatype == 0xc) {
    ffpprsb(fptr,1,lVar3,nelem,(char *)array,status);
  }
  else if (datatype == 0x14) {
    ffpprui(fptr,1,lVar3,nelem,(unsigned_short *)array,status);
  }
  else if (datatype == 0x15) {
    ffppri(fptr,1,lVar3,nelem,(short *)array,status);
  }
  else if (datatype == 0x1e) {
    ffppruk(fptr,1,lVar3,nelem,(uint *)array,status);
  }
  else if (datatype == 0x1f) {
    ffpprk(fptr,1,lVar3,nelem,(int *)array,status);
  }
  else if (datatype == 0x28) {
    ffppruj(fptr,1,lVar3,nelem,(unsigned_long *)array,status);
  }
  else if (datatype == 0x29) {
    ffpprj(fptr,1,lVar3,nelem,(long *)array,status);
  }
  else if (datatype == 0x2a) {
    ffppre(fptr,1,lVar3,nelem,(float *)array,status);
  }
  else if (datatype == 0x50) {
    ffpprujj(fptr,1,lVar3,nelem,(ULONGLONG *)array,status);
  }
  else if (datatype == 0x51) {
    ffpprjj(fptr,1,lVar3,nelem,(LONGLONG *)array,status);
  }
  else if (datatype == 0xb) {
    ffpprb(fptr,1,lVar3,nelem,(uchar *)array,status);
  }
  else {
    *status = 0x19a;
  }
  return *status;
}

Assistant:

int ffppxll(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            LONGLONG  *firstpix, /* I - coord of  first pixel to write(1 based) */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            int  *status)    /* IO - error status                           */
/*
  Write an array of pixels to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written). 
  
  This routine is simillar to ffppr, except it supports writing to 
  large images with more than 2**31 pixels.
*/
{
    int naxis, ii;
    long group = 1;
    LONGLONG firstelem, dimsize = 1, naxes[9];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgiszll(fptr, 9, naxes, status);

    firstelem = 0;
    for (ii=0; ii < naxis; ii++)
    {
        firstelem += ((firstpix[ii] - 1) * dimsize);
        dimsize *= naxes[ii];
    }
    firstelem++;

    if (datatype == TBYTE)
    {
      ffpprb(fptr, group, firstelem, nelem, (unsigned char *) array, status);
    }
    else if (datatype == TSBYTE)
    {
      ffpprsb(fptr, group, firstelem, nelem, (signed char *) array, status);
    }
    else if (datatype == TUSHORT)
    {
      ffpprui(fptr, group, firstelem, nelem, (unsigned short *) array,
              status);
    }
    else if (datatype == TSHORT)
    {
      ffppri(fptr, group, firstelem, nelem, (short *) array, status);
    }
    else if (datatype == TUINT)
    {
      ffppruk(fptr, group, firstelem, nelem, (unsigned int *) array, status);
    }
    else if (datatype == TINT)
    {
      ffpprk(fptr, group, firstelem, nelem, (int *) array, status);
    }
    else if (datatype == TULONG)
    {
      ffppruj(fptr, group, firstelem, nelem, (unsigned long *) array, status);
    }
    else if (datatype == TLONG)
    {
      ffpprj(fptr, group, firstelem, nelem, (long *) array, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpprujj(fptr, group, firstelem, nelem, (ULONGLONG *) array, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpprjj(fptr, group, firstelem, nelem, (LONGLONG *) array, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppre(fptr, group, firstelem, nelem, (float *) array, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpprd(fptr, group, firstelem, nelem, (double *) array, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}